

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::ProcessUse(BackwardPass *this,Opnd *opnd)

{
  Sym *sym_00;
  GlobOpt *this_00;
  StackSym *pSVar1;
  Instr *pIVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  BOOLEAN BVar6;
  bool bVar7;
  BailOutKind BVar8;
  undefined4 *puVar9;
  SymOpnd *symOpnd_00;
  SymOpnd *this_01;
  PropertySymOpnd *pPVar10;
  IndirOpnd *this_02;
  RegOpnd *pRVar11;
  RegOpnd *this_03;
  ArrayRegOpnd *pAVar12;
  RegOpnd *indexOpnd;
  RegOpnd *baseOpnd;
  IndirOpnd *indirOpnd;
  Sym *sym_1;
  SymOpnd *symOpnd;
  ValueType valueType;
  StackSym *pSStack_28;
  StackSym *sym;
  RegOpnd *regOpnd;
  Opnd *opnd_local;
  BackwardPass *this_local;
  
  OVar4 = IR::Opnd::GetKind(opnd);
  if (OVar4 == OpndKindSym) {
    symOpnd_00 = IR::Opnd::AsSymOpnd(opnd);
    sym_00 = symOpnd_00->m_sym;
    bVar7 = IR::Opnd::GetIsJITOptimizedReg(opnd);
    bVar7 = ProcessSymUse(this,sym_00,false,bVar7);
    DoSetDead(this,&symOpnd_00->super_Opnd,(bool)((bVar7 ^ 0xffU) & 1));
    bVar7 = IsCollectionPass(this);
    if ((!bVar7) && (bVar7 = Sym::IsPropertySym(sym_00), bVar7)) {
      if (this->tag == BackwardPhase) {
        this_01 = IR::Opnd::AsSymOpnd(opnd);
        bVar7 = IR::SymOpnd::IsPropertySymOpnd(this_01);
        if (bVar7) {
          this_00 = this->globOpt;
          pPVar10 = IR::Opnd::AsPropertySymOpnd(&symOpnd_00->super_Opnd);
          GlobOpt::PreparePropertySymOpndForTypeCheckSeq
                    (this_00,pPVar10,this->currentInstr,this->currentBlock->loop);
        }
      }
      bVar7 = DoMarkTempNumbersOnTempObjects(this);
      if (bVar7) {
        NumberTemp::ProcessPropertySymUse
                  (&this->currentBlock->tempNumberTracker->super_NumberTemp,symOpnd_00,
                   this->currentInstr,this);
      }
      bVar7 = IR::SymOpnd::IsPropertySymOpnd(symOpnd_00);
      if (bVar7) {
        pPVar10 = IR::Opnd::AsPropertySymOpnd(&symOpnd_00->super_Opnd);
        ProcessPropertySymOpndUse(this,pPVar10);
      }
    }
  }
  else if (OVar4 == OpndKindReg) {
    pRVar11 = IR::Opnd::AsRegOpnd(opnd);
    pSStack_28 = pRVar11->m_sym;
    bVar7 = IsCollectionPass(this);
    if (!bVar7) {
      bVar7 = false;
      if ((pRVar11->field_0x18 & 1) != 0) {
        symOpnd._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(&pRVar11->super_Opnd);
        bVar5 = ValueType::IsNotString((ValueType *)((long)&symOpnd + 6));
        bVar7 = true;
        if (!bVar5) {
          BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                            (this->currentBlock->upwardExposedUses,(pSStack_28->super_Sym).m_id);
          bVar7 = true;
          if (BVar6 == '\0') {
            bVar7 = (*(uint *)&pSStack_28->field_0x18 >> 0x13 & 1) != 0;
          }
        }
      }
      if (bVar7) {
        pRVar11->field_0x18 = pRVar11->field_0x18 & 0xfe;
      }
      CollectCloneStrCandidate(this,opnd);
    }
    pSVar1 = pSStack_28;
    bVar7 = IR::Opnd::GetIsJITOptimizedReg(&pRVar11->super_Opnd);
    bVar7 = ProcessSymUse(this,&pSVar1->super_Sym,true,bVar7);
    DoSetDead(this,&pRVar11->super_Opnd,(bool)((bVar7 ^ 0xffU) & 1));
    bVar7 = IsCollectionPass(this);
    if (!bVar7) {
      if ((this->tag == DeadStorePhase) && (bVar7 = IR::RegOpnd::IsArrayRegOpnd(pRVar11), bVar7)) {
        pIVar2 = this->currentInstr;
        pAVar12 = IR::RegOpnd::AsArrayRegOpnd(pRVar11);
        ProcessArrayRegOpndUse(this,pIVar2,pAVar12);
      }
      if (this->currentInstr->m_opcode == BailOnNotArray) {
        if (this->tag != DeadStorePhase) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1887,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
          if (!bVar7) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        symOpnd._4_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(&pRVar11->super_Opnd);
        bVar7 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)((long)&symOpnd + 4));
        if (bVar7) {
          BVSparse<Memory::JitArenaAllocator>::Clear
                    (this->currentBlock->noImplicitCallUses,(pSStack_28->super_Sym).m_id);
          bVar7 = ValueType::HasNoMissingValues((ValueType *)((long)&symOpnd + 4));
          if (((bVar7) &&
              (bVar7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                 (this->currentBlock->noImplicitCallNoMissingValuesUses), !bVar7))
             && (bVar7 = IsPrePass(this), !bVar7)) {
            BVar8 = IR::Instr::GetBailOutKind(this->currentInstr);
            if ((BVar8 != BailOutOnNotArray) &&
               (BVar8 = IR::Instr::GetBailOutKind(this->currentInstr),
               BVar8 != BailOutOnNotNativeArray)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1898,
                                 "(currentInstr->GetBailOutKind() == IR::BailOutOnNotArray || currentInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray)"
                                 ,
                                 "currentInstr->GetBailOutKind() == IR::BailOutOnNotArray || currentInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray"
                                );
              if (!bVar7) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar9 = 0;
            }
            pIVar2 = this->currentInstr;
            BVar8 = IR::Instr::GetBailOutKind(this->currentInstr);
            BVar8 = IR::operator|(BVar8,BailOutOnMissingValue);
            IR::Instr::SetBailOutKind(pIVar2,BVar8);
          }
          BVSparse<Memory::JitArenaAllocator>::Clear
                    (this->currentBlock->noImplicitCallNoMissingValuesUses,
                     (pSStack_28->super_Sym).m_id);
          BVSparse<Memory::JitArenaAllocator>::Clear
                    (this->currentBlock->noImplicitCallNativeArrayUses,(pSStack_28->super_Sym).m_id)
          ;
        }
      }
    }
  }
  else if (OVar4 == OpndKindIndir) {
    this_02 = IR::Opnd::AsIndirOpnd(opnd);
    pRVar11 = IR::IndirOpnd::GetBaseOpnd(this_02);
    pSVar1 = pRVar11->m_sym;
    bVar7 = IR::Opnd::GetIsJITOptimizedReg(&pRVar11->super_Opnd);
    bVar7 = ProcessSymUse(this,&pSVar1->super_Sym,false,bVar7);
    DoSetDead(this,&pRVar11->super_Opnd,(bool)((bVar7 ^ 0xffU) & 1));
    this_03 = IR::IndirOpnd::GetIndexOpnd(this_02);
    if (this_03 != (RegOpnd *)0x0) {
      pSVar1 = this_03->m_sym;
      bVar7 = IR::Opnd::GetIsJITOptimizedReg(&this_03->super_Opnd);
      bVar7 = ProcessSymUse(this,&pSVar1->super_Sym,false,bVar7);
      DoSetDead(this,&this_03->super_Opnd,(bool)((bVar7 ^ 0xffU) & 1));
    }
    bVar7 = IsCollectionPass(this);
    if (!bVar7) {
      bVar7 = DoMarkTempNumbersOnTempObjects(this);
      if (bVar7) {
        NumberTemp::ProcessIndirUse
                  (&this->currentBlock->tempNumberTracker->super_NumberTemp,this_02,
                   this->currentInstr,this);
      }
      if ((this->tag == DeadStorePhase) && (bVar7 = IR::RegOpnd::IsArrayRegOpnd(pRVar11), bVar7)) {
        pIVar2 = this->currentInstr;
        pAVar12 = IR::RegOpnd::AsArrayRegOpnd(pRVar11);
        ProcessArrayRegOpndUse(this,pIVar2,pAVar12);
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessUse(IR::Opnd * opnd)
{
    switch (opnd->GetKind())
    {
    case IR::OpndKindReg:
        {
            IR::RegOpnd *regOpnd = opnd->AsRegOpnd();
            StackSym *sym = regOpnd->m_sym;

            if (!IsCollectionPass())
            {
                // isTempLastUse is only used for string concat right now, so lets not mark it if it's not a string.
                // If it's upward exposed, it is not it's last use.
                if (regOpnd->m_isTempLastUse && (regOpnd->GetValueType().IsNotString() || this->currentBlock->upwardExposedUses->Test(sym->m_id) || sym->m_mayNotBeTempLastUse))
                {
                    regOpnd->m_isTempLastUse = false;
                }
                this->CollectCloneStrCandidate(opnd);
            }

            this->DoSetDead(regOpnd, !this->ProcessSymUse(sym, true, regOpnd->GetIsJITOptimizedReg()));

            if (IsCollectionPass())
            {
                break;
            }

            if (tag == Js::DeadStorePhase && regOpnd->IsArrayRegOpnd())
            {
                ProcessArrayRegOpndUse(currentInstr, regOpnd->AsArrayRegOpnd());
            }

            if (currentInstr->m_opcode == Js::OpCode::BailOnNotArray)
            {
                Assert(tag == Js::DeadStorePhase);

                const ValueType valueType(regOpnd->GetValueType());
                if(valueType.IsLikelyArrayOrObjectWithArray())
                {
                    currentBlock->noImplicitCallUses->Clear(sym->m_id);

                    // We are being conservative here to always check for missing value
                    // if any of them expect no missing value. That is because we don't know
                    // what set of sym is equivalent (copied) from the one we are testing for right now.
                    if(valueType.HasNoMissingValues() &&
                        !currentBlock->noImplicitCallNoMissingValuesUses->IsEmpty() &&
                        !IsPrePass())
                    {
                        // There is a use of this sym that requires this array to have no missing values, so this instruction
                        // needs to bail out if the array has missing values.
                        Assert(currentInstr->GetBailOutKind() == IR::BailOutOnNotArray ||
                               currentInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray);
                        currentInstr->SetBailOutKind(currentInstr->GetBailOutKind() | IR::BailOutOnMissingValue);
                    }

                    currentBlock->noImplicitCallNoMissingValuesUses->Clear(sym->m_id);
                    currentBlock->noImplicitCallNativeArrayUses->Clear(sym->m_id);
                }
            }
        }
        break;
    case IR::OpndKindSym:
        {
            IR::SymOpnd *symOpnd = opnd->AsSymOpnd();
            Sym * sym = symOpnd->m_sym;

            this->DoSetDead(symOpnd, !this->ProcessSymUse(sym, false, opnd->GetIsJITOptimizedReg()));

            if (IsCollectionPass())
            {
                break;
            }

            if (sym->IsPropertySym())
            {
                // TODO: We don't have last use info for property sym
                // and we don't set the last use of the stacksym inside the property sym
                if (tag == Js::BackwardPhase)
                {
                    if (opnd->AsSymOpnd()->IsPropertySymOpnd())
                    {
                        this->globOpt->PreparePropertySymOpndForTypeCheckSeq(symOpnd->AsPropertySymOpnd(), this->currentInstr, this->currentBlock->loop);
                    }
                }

                if (this->DoMarkTempNumbersOnTempObjects())
                {
                    this->currentBlock->tempNumberTracker->ProcessPropertySymUse(symOpnd, this->currentInstr, this);
                }

                if (symOpnd->IsPropertySymOpnd())
                {
                    this->ProcessPropertySymOpndUse(symOpnd->AsPropertySymOpnd());
                }
            }
        }
        break;
    case IR::OpndKindIndir:
        {
            IR::IndirOpnd * indirOpnd = opnd->AsIndirOpnd();
            IR::RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();

            this->DoSetDead(baseOpnd, !this->ProcessSymUse(baseOpnd->m_sym, false, baseOpnd->GetIsJITOptimizedReg()));

            IR::RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
            if (indexOpnd)
            {
                this->DoSetDead(indexOpnd, !this->ProcessSymUse(indexOpnd->m_sym, false, indexOpnd->GetIsJITOptimizedReg()));
            }

            if(IsCollectionPass())
            {
                break;
            }

            if (this->DoMarkTempNumbersOnTempObjects())
            {
                this->currentBlock->tempNumberTracker->ProcessIndirUse(indirOpnd, currentInstr, this);
            }

            if(tag == Js::DeadStorePhase && baseOpnd->IsArrayRegOpnd())
            {
                ProcessArrayRegOpndUse(currentInstr, baseOpnd->AsArrayRegOpnd());
            }
        }
        break;
    }
}